

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::LossLayer::_InternalParse(LossLayer *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  internal *this_01;
  size_t size;
  ulong uVar2;
  bool bVar3;
  string *s;
  CategoricalCrossEntropyLossLayer *msg;
  uint uVar4;
  char cVar5;
  uint res;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar7;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  StringPiece str;
  byte *local_40;
  ArenaStringPtr *local_38;
  char *field_name;
  
  local_40 = (byte *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->name_;
    do {
      bVar1 = *local_40;
      res = (uint)bVar1;
      pbVar7 = local_40 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar7 * 0x80) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
          pbVar7 = (byte *)pVar9.first;
          res = pVar9.second;
        }
        else {
          pbVar7 = local_40 + 2;
        }
      }
      uVar4 = res >> 3;
      field_name = (char *)(ulong)uVar4;
      cVar5 = (char)res;
      local_40 = pbVar7;
      if (uVar4 == 0xb) {
        if (cVar5 != 'Z') goto LAB_002a300d;
        if (this->_oneof_case_[0] == 0xb) {
LAB_002a3007:
          msg = (this->LossLayerType_).categoricalcrossentropylosslayer_;
        }
        else {
          clear_LossLayerType(this);
          this->_oneof_case_[0] = 0xb;
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            pAVar8 = *(Arena **)pAVar8;
          }
          msg = (CategoricalCrossEntropyLossLayer *)
                google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::MeanSquaredErrorLossLayer>(pAVar8);
LAB_002a306b:
          (this->LossLayerType_).categoricalcrossentropylosslayer_ = msg;
        }
        local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_40);
      }
      else {
        if (uVar4 == 10) {
          if (cVar5 == 'R') {
            if (this->_oneof_case_[0] != 10) {
              clear_LossLayerType(this);
              this->_oneof_case_[0] = 10;
              uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar8 = (Arena *)(uVar2 & 0xfffffffffffffffc);
              if ((uVar2 & 1) != 0) {
                pAVar8 = *(Arena **)pAVar8;
              }
              msg = google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::CategoricalCrossEntropyLossLayer>
                              (pAVar8);
              goto LAB_002a306b;
            }
            goto LAB_002a3007;
          }
        }
        else if ((uVar4 == 1) && (cVar5 == '\n')) {
          puVar6 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            puVar6 = (undefined8 *)*puVar6;
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar6);
          local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (s,(char *)local_40,ctx);
          this_01 = (internal *)(s->_M_dataplus)._M_p;
          size = s->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar3 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
          if (!bVar3) {
            return (char *)0x0;
          }
          goto joined_r0x002a2fb8;
        }
LAB_002a300d:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar7 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar7;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_40,ctx);
      }
joined_r0x002a2fb8:
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_40;
}

Assistant:

const char* LossLayer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_categoricalcrossentropylosslayer(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          ptr = ctx->ParseMessage(_internal_mutable_meansquarederrorlosslayer(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}